

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall sznet::TimerQueue::~TimerQueue(TimerQueue *this)

{
  uint32_t uVar1;
  size_type sVar2;
  Timer *this_00;
  Timer *timer;
  TimerQueue *this_local;
  
  uVar1 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar2 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar1 != sVar2) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x28,"sznet::TimerQueue::~TimerQueue()");
  }
  while (this_00 = MinHeap<sznet::Timer>::pop(&this->m_timerMinHeap), this_00 != (Timer *)0x0) {
    if (this_00 != (Timer *)0x0) {
      Timer::~Timer(this_00);
      operator_delete(this_00);
    }
  }
  std::
  set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
  ::clear(&this->m_activeTimers);
  uVar1 = MinHeap<sznet::Timer>::size(&this->m_timerMinHeap);
  sVar2 = std::
          set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
          ::size(&this->m_activeTimers);
  if (uVar1 != sVar2) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x34,"sznet::TimerQueue::~TimerQueue()");
  }
  std::
  set<std::pair<sznet::Timer_*,_long>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
  ::~set(&this->m_activeTimers);
  MinHeap<sznet::Timer>::~MinHeap(&this->m_timerMinHeap);
  return;
}

Assistant:

TimerQueue::~TimerQueue()
{
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.pop();
		if (!timer)
		{
			break;
		}
		delete timer;
		timer = nullptr;
	}
	m_activeTimers.clear();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}